

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

void tinyobj::LoadMtl(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *material_map,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     istream *inStream,string *warning,string *err)

{
  string *psVar1;
  size_t *this;
  char cVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  ostream *poVar11;
  texture_option_t *texopt;
  string *texname;
  char *pcVar12;
  char *pcVar13;
  float fVar14;
  float fVar15;
  stringstream local_b20 [8];
  stringstream warn_ss;
  ostream local_b10 [112];
  ios_base local_aa0 [264];
  undefined1 local_998 [8];
  material_t material;
  stringstream sstr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  int local_230;
  ios_base local_1d0 [264];
  string *local_c8;
  undefined1 local_c0 [8];
  string value;
  undefined1 local_98 [8];
  string key;
  string linebuf;
  
  local_998 = (undefined1  [8])&material.name._M_string_length;
  material.name._M_dataplus._M_p = (pointer)0x0;
  material.name._M_string_length._0_1_ = 0;
  material._104_8_ = &material.ambient_texname._M_string_length;
  material.ambient_texname._M_dataplus._M_p = (pointer)0x0;
  material.ambient_texname._M_string_length._0_1_ = 0;
  material.ambient_texname.field_2._8_8_ = &material.diffuse_texname._M_string_length;
  material.diffuse_texname._M_dataplus._M_p = (pointer)0x0;
  material.diffuse_texname._M_string_length._0_1_ = 0;
  material.diffuse_texname.field_2._8_8_ = &material.specular_texname._M_string_length;
  material.specular_texname._M_dataplus._M_p = (pointer)0x0;
  material.specular_texname._M_string_length._0_1_ = 0;
  material.specular_texname.field_2._8_8_ = &material.specular_highlight_texname._M_string_length;
  material.specular_highlight_texname._M_dataplus._M_p = (pointer)0x0;
  material.specular_highlight_texname._M_string_length._0_1_ = 0;
  material.specular_highlight_texname.field_2._8_8_ = &material.bump_texname._M_string_length;
  material.bump_texname._M_dataplus._M_p = (pointer)0x0;
  material.bump_texname._M_string_length._0_1_ = 0;
  material.bump_texname.field_2._8_8_ = &material.displacement_texname._M_string_length;
  material.displacement_texname._M_dataplus._M_p = (pointer)0x0;
  material.displacement_texname._M_string_length._0_1_ = 0;
  material.displacement_texname.field_2._8_8_ = &material.alpha_texname._M_string_length;
  material.alpha_texname._M_dataplus._M_p = (pointer)0x0;
  material.alpha_texname._M_string_length._0_1_ = 0;
  material.alpha_texname.field_2._8_8_ = &material.reflection_texname._M_string_length;
  material.reflection_texname._M_dataplus._M_p = (pointer)0x0;
  material.reflection_texname._M_string_length._0_1_ = 0;
  material.ambient_texopt._56_8_ = &material.ambient_texopt.colorspace._M_string_length;
  material.ambient_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.ambient_texopt.colorspace._M_string_length._0_1_ = 0;
  material.diffuse_texopt._56_8_ = &material.diffuse_texopt.colorspace._M_string_length;
  material.diffuse_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.diffuse_texopt.colorspace._M_string_length._0_1_ = 0;
  material.specular_texopt._56_8_ = &material.specular_texopt.colorspace._M_string_length;
  material.specular_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.specular_texopt.colorspace._M_string_length._0_1_ = 0;
  material.specular_highlight_texopt._56_8_ =
       &material.specular_highlight_texopt.colorspace._M_string_length;
  material.specular_highlight_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.specular_highlight_texopt.colorspace._M_string_length._0_1_ = 0;
  material.bump_texopt._56_8_ = &material.bump_texopt.colorspace._M_string_length;
  material.bump_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.bump_texopt.colorspace._M_string_length._0_1_ = 0;
  material.displacement_texopt._56_8_ = &material.displacement_texopt.colorspace._M_string_length;
  material.displacement_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.displacement_texopt.colorspace._M_string_length._0_1_ = 0;
  material.alpha_texopt._56_8_ = &material.alpha_texopt.colorspace._M_string_length;
  material.alpha_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.alpha_texopt.colorspace._M_string_length._0_1_ = 0;
  material.reflection_texopt._56_8_ = &material.reflection_texopt.colorspace._M_string_length;
  material.reflection_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.reflection_texopt.colorspace._M_string_length._0_1_ = 0;
  material._1160_8_ = &material.roughness_texname._M_string_length;
  material.roughness_texname._M_dataplus._M_p = (pointer)0x0;
  material.roughness_texname._M_string_length._0_1_ = 0;
  material.roughness_texname.field_2._8_8_ = &material.metallic_texname._M_string_length;
  material.metallic_texname._M_dataplus._M_p = (pointer)0x0;
  material.metallic_texname._M_string_length._0_1_ = 0;
  material.metallic_texname.field_2._8_8_ = &material.sheen_texname._M_string_length;
  material.sheen_texname._M_dataplus._M_p = (pointer)0x0;
  material.sheen_texname._M_string_length._0_1_ = 0;
  material.sheen_texname.field_2._8_8_ = &material.emissive_texname._M_string_length;
  material.emissive_texname._M_dataplus._M_p = (pointer)0x0;
  material.emissive_texname._M_string_length._0_1_ = 0;
  material.emissive_texname.field_2._8_8_ = &material.normal_texname._M_string_length;
  material.normal_texname._M_dataplus._M_p = (pointer)0x0;
  material.normal_texname._M_string_length._0_1_ = 0;
  material.roughness_texopt._56_8_ = &material.roughness_texopt.colorspace._M_string_length;
  material.roughness_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.roughness_texopt.colorspace._M_string_length._0_1_ = 0;
  material.metallic_texopt._56_8_ = &material.metallic_texopt.colorspace._M_string_length;
  material.metallic_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.metallic_texopt.colorspace._M_string_length._0_1_ = 0;
  material.sheen_texopt._56_8_ = &material.sheen_texopt.colorspace._M_string_length;
  material.sheen_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.sheen_texopt.colorspace._M_string_length._0_1_ = 0;
  material.emissive_texopt._56_8_ = &material.emissive_texopt.colorspace._M_string_length;
  material.emissive_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.emissive_texopt.colorspace._M_string_length._0_1_ = 0;
  material.normal_texopt._56_8_ = &material.normal_texopt.colorspace._M_string_length;
  material.normal_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.normal_texopt.colorspace._M_string_length._0_1_ = 0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&material.unknown_parameter;
  material.unknown_parameter._M_t._M_impl._0_4_ = 0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  value.field_2._8_8_ = material_map;
  linebuf.field_2._8_8_ = materials;
  InitMaterial((material_t *)local_998);
  local_c8 = warning;
  std::__cxx11::stringstream::stringstream(local_b20);
  key.field_2._8_8_ = &linebuf._M_string_length;
  linebuf._M_dataplus._M_p = (pointer)0x0;
  linebuf._M_string_length._0_1_ = 0;
  psVar1 = (string *)(key.field_2._M_local_buf + 8);
  this = &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count;
  bVar7 = false;
LAB_001124fc:
  bVar8 = false;
  bVar5 = false;
LAB_0011250a:
  while( true ) {
    do {
      do {
        iVar9 = std::istream::peek();
        if (iVar9 == -1) {
          lVar3 = *(long *)linebuf.field_2._8_8_;
          lVar4 = *(long *)(linebuf.field_2._8_8_ + 8);
          material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)&local_240;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     local_998,material.name._M_dataplus._M_p + (long)local_998);
          local_230 = (int)((ulong)(lVar4 - lVar3) >> 3) * 0x1fdcd759;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)value.field_2._8_8_,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)&material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
          psVar1 = local_c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              &local_240) {
            operator_delete((void *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,local_240._M_allocated_capacity + 1);
          }
          std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                    ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                     linebuf.field_2._8_8_,(value_type *)local_998);
          if (psVar1 != (string *)0x0) {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=
                      ((string *)psVar1,
                       (string *)
                       &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                &local_240) {
              operator_delete((void *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,local_240._M_allocated_capacity + 1);
            }
          }
          if ((size_type *)key.field_2._8_8_ != &linebuf._M_string_length) {
            operator_delete((void *)key.field_2._8_8_,
                            CONCAT71(linebuf._M_string_length._1_7_,
                                     (undefined1)linebuf._M_string_length) + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_b20);
          std::ios_base::~ios_base(local_aa0);
          material_t::~material_t((material_t *)local_998);
          return;
        }
        safeGetline(inStream,psVar1);
        if (linebuf._M_dataplus._M_p != (pointer)0x0) {
          std::__cxx11::string::find_last_not_of((char *)psVar1,0x1496b8,0xffffffffffffffff);
          std::__cxx11::string::substr((ulong)this,(ulong)psVar1);
          std::__cxx11::string::operator=((string *)psVar1,(string *)this);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              &local_240) {
            operator_delete((void *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,local_240._M_allocated_capacity + 1);
          }
        }
        uVar6 = key.field_2._8_8_;
        if ((linebuf._M_dataplus._M_p != (pointer)0x0) &&
           (linebuf._M_dataplus._M_p[key.field_2._8_8_ + -1] == '\n')) {
          linebuf._M_dataplus._M_p = linebuf._M_dataplus._M_p + -1;
          linebuf._M_dataplus._M_p[key.field_2._8_8_] = '\0';
        }
        if ((linebuf._M_dataplus._M_p != (pointer)0x0) &&
           (linebuf._M_dataplus._M_p[key.field_2._8_8_ + -1] == '\r')) {
          linebuf._M_dataplus._M_p = linebuf._M_dataplus._M_p + -1;
          linebuf._M_dataplus._M_p[key.field_2._8_8_] = '\0';
        }
      } while (linebuf._M_dataplus._M_p == (pointer)0x0);
      sVar10 = strspn((char *)key.field_2._8_8_," \t");
      if (uVar6 == 0) {
        __assert_fail("token",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                      ,0x6b3,
                      "void tinyobj::LoadMtl(std::map<std::string, int> *, std::vector<material_t> *, std::istream *, std::string *, std::string *)"
                     );
      }
      pcVar12 = (char *)(uVar6 + sVar10);
      cVar2 = *pcVar12;
    } while ((cVar2 == '\0') || (cVar2 == '#'));
    iVar9 = strncmp(pcVar12,"newmtl",6);
    if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) goto LAB_001138df;
    if (cVar2 != 'K') break;
    if ((pcVar12[1] == 'a') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar13 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      pcVar12 = pcVar13 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar12,(double *)this);
      fVar14 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar12," \t");
      pcVar12 = pcVar12 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      pcVar13 = pcVar12 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar13,(double *)this);
      fVar15 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar13," \t");
      pcVar13 = pcVar13 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar13 + sVar10,(double *)this);
      material.ambient[0] =
           (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      material.name.field_2._8_4_ = fVar14;
      material.name.field_2._12_4_ = fVar15;
    }
    else if ((pcVar12[1] == 'd') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar13 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      pcVar12 = pcVar13 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar12,(double *)this);
      fVar14 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar12," \t");
      pcVar12 = pcVar12 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      pcVar13 = pcVar12 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar13,(double *)this);
      fVar15 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar13," \t");
      pcVar13 = pcVar13 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar13 + sVar10,(double *)this);
      material.diffuse[0] =
           (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      material.ambient[2] = fVar15;
      material.ambient[1] = fVar14;
      bVar7 = true;
    }
    else if ((pcVar12[1] == 's') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar13 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      pcVar12 = pcVar13 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar12,(double *)this);
      fVar14 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar12," \t");
      pcVar12 = pcVar12 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      pcVar13 = pcVar12 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar13,(double *)this);
      fVar15 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar13," \t");
      pcVar13 = pcVar13 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar13 + sVar10,(double *)this);
      material.specular[0] =
           (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      material.diffuse[1] = fVar14;
      material.diffuse[2] = fVar15;
    }
    else {
      if ((pcVar12[1] != 't') || ((pcVar12[2] != '\t' && (pcVar12[2] != ' ')))) break;
LAB_00112a46:
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar12 = pcVar12 + sVar10 + 2;
      sVar10 = strcspn(pcVar12," \t\r");
      pcVar13 = pcVar12 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar13,(double *)this);
      fVar14 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar13," \t");
      pcVar13 = pcVar13 + sVar10;
      sVar10 = strcspn(pcVar13," \t\r");
      pcVar12 = pcVar13 + sVar10;
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar13,pcVar12,(double *)this);
      fVar15 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
      sVar10 = strspn(pcVar12," \t");
      pcVar12 = pcVar12 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
      material.transmittance[0] =
           (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      material.specular[1] = fVar14;
      material.specular[2] = fVar15;
    }
  }
  if (((cVar2 == 'T') && (pcVar12[1] == 'f')) && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t'))))
  goto LAB_00112a46;
  if ((cVar2 == 'N') && ((pcVar12[1] == 'i' && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))))) {
    sVar10 = strspn(pcVar12 + 2," \t");
    pcVar12 = pcVar12 + 2 + sVar10;
    sVar10 = strcspn(pcVar12," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
    material.emission[2] =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    goto LAB_0011250a;
  }
  if (((cVar2 == 'K') && (pcVar12[1] == 'e')) && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
    sVar10 = strspn(pcVar12 + 2," \t");
    pcVar13 = pcVar12 + 2 + sVar10;
    sVar10 = strcspn(pcVar13," \t\r");
    pcVar12 = pcVar13 + sVar10;
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar13,pcVar12,(double *)this);
    fVar14 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count;
    sVar10 = strspn(pcVar12," \t");
    pcVar12 = pcVar12 + sVar10;
    sVar10 = strcspn(pcVar12," \t\r");
    pcVar13 = pcVar12 + sVar10;
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar13,(double *)this);
    fVar15 = (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count;
    sVar10 = strspn(pcVar13," \t");
    pcVar13 = pcVar13 + sVar10;
    sVar10 = strcspn(pcVar13," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar13,pcVar13 + sVar10,(double *)this);
    material.emission[0] =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    material.transmittance[1] = fVar14;
    material.transmittance[2] = fVar15;
    goto LAB_0011250a;
  }
  if (((cVar2 == 'N') && (pcVar12[1] == 's')) && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
    sVar10 = strspn(pcVar12 + 2," \t");
    pcVar12 = pcVar12 + 2 + sVar10;
    sVar10 = strcspn(pcVar12," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
    material.emission[1] =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    goto LAB_0011250a;
  }
  iVar9 = strncmp(pcVar12,"illum",5);
  if ((iVar9 == 0) && ((pcVar12[5] == ' ' || (pcVar12[5] == '\t')))) {
    sVar10 = strspn(pcVar12 + 6," \t");
    material.ior = (real_t)atoi(pcVar12 + sVar10 + 6);
    goto LAB_0011250a;
  }
  if ((cVar2 == 'd') && ((pcVar12[1] == ' ' || (pcVar12[1] == '\t')))) {
    sVar10 = strspn(pcVar12 + 1," \t");
    pcVar12 = pcVar12 + 1 + sVar10;
    sVar10 = strcspn(pcVar12," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
    material.shininess =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    bVar5 = true;
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_b10,"Both `d` and `Tr` parameters defined for \"",0x2a);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_b10,(char *)local_998,(long)material.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\". Use the value of `d` for dissolve (line ",0x2b);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," in .mtl.)",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      bVar5 = true;
    }
    goto LAB_0011250a;
  }
  if (((cVar2 == 'T') && (pcVar12[1] == 'r')) && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_b10,"Both `d` and `Tr` parameters defined for \"",0x2a);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_b10,(char *)local_998,(long)material.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\". Use the value of `d` for dissolve (line ",0x2b);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," in .mtl.)",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      bVar8 = true;
      std::ostream::flush();
    }
    else {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar12 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
      material.shininess =
           1.0 - (float)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count;
      bVar8 = true;
    }
    goto LAB_0011250a;
  }
  if (cVar2 == 'P') {
    if ((pcVar12[1] == 'r') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar12 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
      material.reflection_texopt.colorspace.field_2._8_4_ =
           (undefined4)
           (double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count;
      goto LAB_0011250a;
    }
    if ((pcVar12[1] == 'm') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar12 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
      material.reflection_texopt.colorspace.field_2._12_4_ =
           (undefined4)
           (double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count;
      goto LAB_0011250a;
    }
    if ((pcVar12[1] == 's') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar12 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
      material.roughness =
           (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      goto LAB_0011250a;
    }
    if ((pcVar12[1] == 'c') && ((pcVar12[2] == ' ' || (pcVar12[2] == '\t')))) {
      sVar10 = strspn(pcVar12 + 2," \t");
      pcVar12 = pcVar12 + 2 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
      material.metallic =
           (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      goto LAB_0011250a;
    }
  }
  iVar9 = strncmp(pcVar12,"Pcr",3);
  if ((iVar9 == 0) && ((pcVar12[3] == ' ' || (pcVar12[3] == '\t')))) {
    sVar10 = strspn(pcVar12 + 4," \t");
    pcVar12 = pcVar12 + sVar10 + 4;
    sVar10 = strcspn(pcVar12," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
    material.sheen =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    goto LAB_0011250a;
  }
  iVar9 = strncmp(pcVar12,"aniso",5);
  if ((iVar9 == 0) && ((pcVar12[5] == ' ' || (pcVar12[5] == '\t')))) {
    sVar10 = strspn(pcVar12 + 6," \t");
    pcVar12 = pcVar12 + sVar10 + 6;
    sVar10 = strcspn(pcVar12," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
    material.clearcoat_thickness =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    goto LAB_0011250a;
  }
  iVar9 = strncmp(pcVar12,"anisor",6);
  if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
    sVar10 = strspn(pcVar12 + 7," \t");
    pcVar12 = pcVar12 + sVar10 + 7;
    sVar10 = strcspn(pcVar12," \t\r");
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)this);
    material.clearcoat_roughness =
         (real_t)(double)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    goto LAB_0011250a;
  }
  iVar9 = strncmp(pcVar12,"map_Ka",6);
  if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
    pcVar12 = pcVar12 + 7;
    texname = (string *)&material.illum;
    texopt = (texture_option_t *)((long)&material.reflection_texname.field_2 + 8);
  }
  else {
    iVar9 = strncmp(pcVar12,"map_Kd",6);
    if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
      ParseTextureNameAndOption
                ((string *)((long)&material.ambient_texname.field_2 + 8),
                 (texture_option_t *)((long)&material.ambient_texopt.colorspace.field_2 + 8),
                 pcVar12 + 7);
      if (!bVar7) {
        material.ambient[1] = 0.6;
        material.ambient[2] = 0.6;
        material.diffuse[0] = 0.6;
      }
      goto LAB_0011250a;
    }
    iVar9 = strncmp(pcVar12,"map_Ks",6);
    if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
      pcVar12 = pcVar12 + 7;
      texname = (string *)((long)&material.diffuse_texname.field_2 + 8);
      texopt = (texture_option_t *)((long)&material.diffuse_texopt.colorspace.field_2 + 8);
    }
    else {
      iVar9 = strncmp(pcVar12,"map_Ns",6);
      if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
        pcVar12 = pcVar12 + 7;
        texname = (string *)((long)&material.specular_texname.field_2 + 8);
        texopt = (texture_option_t *)((long)&material.specular_texopt.colorspace.field_2 + 8);
      }
      else {
        iVar9 = strncmp(pcVar12,"map_bump",8);
        if (((iVar9 == 0) && ((pcVar12[8] == ' ' || (pcVar12[8] == '\t')))) ||
           ((iVar9 = strncmp(pcVar12,"map_Bump",8), iVar9 == 0 &&
            ((pcVar12[8] == ' ' || (pcVar12[8] == '\t')))))) {
          pcVar12 = pcVar12 + 9;
        }
        else {
          iVar9 = strncmp(pcVar12,"bump",4);
          if ((iVar9 != 0) || ((pcVar12[4] != ' ' && (pcVar12[4] != '\t')))) {
            iVar9 = strncmp(pcVar12,"map_d",5);
            if ((iVar9 == 0) && ((pcVar12[5] == ' ' || (pcVar12[5] == '\t')))) {
              pcVar12 = pcVar12 + 6;
              std::__cxx11::string::operator=
                        ((string *)(material.displacement_texname.field_2._M_local_buf + 8),pcVar12)
              ;
              texname = (string *)((long)&material.displacement_texname.field_2 + 8);
              texopt = (texture_option_t *)
                       ((long)&material.displacement_texopt.colorspace.field_2 + 8);
              goto LAB_00113779;
            }
            iVar9 = strncmp(pcVar12,"disp",4);
            if ((iVar9 == 0) && ((pcVar12[4] == ' ' || (pcVar12[4] == '\t')))) {
              pcVar12 = pcVar12 + 5;
              texname = (string *)((long)&material.bump_texname.field_2 + 8);
              texopt = (texture_option_t *)((long)&material.bump_texopt.colorspace.field_2 + 8);
            }
            else {
              iVar9 = strncmp(pcVar12,"refl",4);
              if ((iVar9 == 0) && ((pcVar12[4] == ' ' || (pcVar12[4] == '\t')))) {
                pcVar12 = pcVar12 + 5;
                texname = (string *)((long)&material.alpha_texname.field_2 + 8);
                texopt = (texture_option_t *)((long)&material.alpha_texopt.colorspace.field_2 + 8);
              }
              else {
                iVar9 = strncmp(pcVar12,"map_Pr",6);
                if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
                  pcVar12 = pcVar12 + 7;
                  texname = (string *)&material.anisotropy_rotation;
                  texopt = (texture_option_t *)((long)&material.normal_texname.field_2 + 8);
                }
                else {
                  iVar9 = strncmp(pcVar12,"map_Pm",6);
                  if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
                    pcVar12 = pcVar12 + 7;
                    texname = (string *)((long)&material.roughness_texname.field_2 + 8);
                    texopt = (texture_option_t *)
                             ((long)&material.roughness_texopt.colorspace.field_2 + 8);
                  }
                  else {
                    iVar9 = strncmp(pcVar12,"map_Ps",6);
                    if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
                      pcVar12 = pcVar12 + 7;
                      texname = (string *)((long)&material.metallic_texname.field_2 + 8);
                      texopt = (texture_option_t *)
                               ((long)&material.metallic_texopt.colorspace.field_2 + 8);
                    }
                    else {
                      iVar9 = strncmp(pcVar12,"map_Ke",6);
                      if ((iVar9 == 0) && ((pcVar12[6] == ' ' || (pcVar12[6] == '\t')))) {
                        pcVar12 = pcVar12 + 7;
                        texname = (string *)((long)&material.sheen_texname.field_2 + 8);
                        texopt = (texture_option_t *)
                                 ((long)&material.sheen_texopt.colorspace.field_2 + 8);
                      }
                      else {
                        iVar9 = strncmp(pcVar12,"norm",4);
                        if ((iVar9 != 0) || ((pcVar12[4] != ' ' && (pcVar12[4] != '\t')))) {
                          pcVar13 = strchr(pcVar12,0x20);
                          if (pcVar13 == (char *)0x0) {
                            pcVar13 = strchr(pcVar12,9);
                          }
                          if (pcVar13 != (char *)0x0) {
                            local_98 = (undefined1  [8])&key._M_string_length;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_98,pcVar12,pcVar13);
                            local_c0 = (undefined1  [8])&value._M_string_length;
                            sVar10 = strlen(pcVar13 + 1);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_c0,pcVar13 + 1,pcVar13 + sVar10 + 1);
                            std::
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_98,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_c0);
                            std::
                            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            ::
                            _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                        *)&material.pad2,
                                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)this);
                            std::
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)this);
                            if (local_c0 != (undefined1  [8])&value._M_string_length) {
                              operator_delete((void *)local_c0,value._M_string_length + 1);
                            }
                            if (local_98 != (undefined1  [8])&key._M_string_length) {
                              operator_delete((void *)local_98,key._M_string_length + 1);
                            }
                          }
                          goto LAB_0011250a;
                        }
                        pcVar12 = pcVar12 + 5;
                        texname = (string *)((long)&material.emissive_texname.field_2 + 8);
                        texopt = (texture_option_t *)
                                 ((long)&material.emissive_texopt.colorspace.field_2 + 8);
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00113779;
          }
          pcVar12 = pcVar12 + 5;
        }
        texname = (string *)((long)&material.specular_highlight_texname.field_2 + 8);
        texopt = (texture_option_t *)
                 ((long)&material.specular_highlight_texopt.colorspace.field_2 + 8);
      }
    }
  }
LAB_00113779:
  ParseTextureNameAndOption(texname,texopt,pcVar12);
  goto LAB_0011250a;
LAB_001138df:
  if (material.name._M_dataplus._M_p != (pointer)0x0) {
    lVar3 = *(long *)linebuf.field_2._8_8_;
    lVar4 = *(long *)(linebuf.field_2._8_8_ + 8);
    material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_240
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this,local_998,material.name._M_dataplus._M_p + (long)local_998);
    local_230 = (int)((ulong)(lVar4 - lVar3) >> 3) * 0x1fdcd759;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)value.field_2._8_8_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_240
       ) {
      operator_delete((void *)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,local_240._M_allocated_capacity + 1);
    }
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
              ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
               linebuf.field_2._8_8_,(value_type *)local_998);
  }
  InitMaterial((material_t *)local_998);
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  sVar10 = strlen(pcVar12 + 7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_240._M_local_buf,pcVar12 + 7,sVar10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_998,(string *)local_98);
  if (local_98 != (undefined1  [8])&key._M_string_length) {
    operator_delete((void *)local_98,key._M_string_length + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)this);
  std::ios_base::~ios_base(local_1d0);
  goto LAB_001124fc;
}

Assistant:

void LoadMtl(std::map<std::string, int> *material_map,
             std::vector<material_t> *materials, std::istream *inStream,
             std::string *warning, std::string *err) {
  (void)err;

  // Create a default material anyway.
  material_t material;
  InitMaterial(&material);

  // Issue 43. `d` wins against `Tr` since `Tr` is not in the MTL specification.
  bool has_d = false;
  bool has_tr = false;

  // has_kd is used to set a default diffuse value when map_Kd is present
  // and Kd is not.
  bool has_kd = false;

  std::stringstream warn_ss;

  size_t line_no = 0;
  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);
    line_no++;

    // Trim trailing whitespace.
    if (linebuf.size() > 0) {
      linebuf = linebuf.substr(0, linebuf.find_last_not_of(" \t") + 1);
    }

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // new mtl
    if ((0 == strncmp(token, "newmtl", 6)) && IS_SPACE((token[6]))) {
      // flush previous material.
      if (!material.name.empty()) {
        material_map->insert(std::pair<std::string, int>(
            material.name, static_cast<int>(materials->size())));
        materials->push_back(material);
      }

      // initial temporary material
      InitMaterial(&material);

      has_d = false;
      has_tr = false;

      // set new mtl name
      token += 7;
      {
        std::stringstream sstr;
        sstr << token;
        material.name = sstr.str();
      }
      continue;
    }

    // ambient
    if (token[0] == 'K' && token[1] == 'a' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.ambient[0] = r;
      material.ambient[1] = g;
      material.ambient[2] = b;
      continue;
    }

    // diffuse
    if (token[0] == 'K' && token[1] == 'd' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.diffuse[0] = r;
      material.diffuse[1] = g;
      material.diffuse[2] = b;
      has_kd = true;
      continue;
    }

    // specular
    if (token[0] == 'K' && token[1] == 's' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.specular[0] = r;
      material.specular[1] = g;
      material.specular[2] = b;
      continue;
    }

    // transmittance
    if ((token[0] == 'K' && token[1] == 't' && IS_SPACE((token[2]))) ||
        (token[0] == 'T' && token[1] == 'f' && IS_SPACE((token[2])))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.transmittance[0] = r;
      material.transmittance[1] = g;
      material.transmittance[2] = b;
      continue;
    }

    // ior(index of refraction)
    if (token[0] == 'N' && token[1] == 'i' && IS_SPACE((token[2]))) {
      token += 2;
      material.ior = parseReal(&token);
      continue;
    }

    // emission
    if (token[0] == 'K' && token[1] == 'e' && IS_SPACE(token[2])) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.emission[0] = r;
      material.emission[1] = g;
      material.emission[2] = b;
      continue;
    }

    // shininess
    if (token[0] == 'N' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.shininess = parseReal(&token);
      continue;
    }

    // illum model
    if (0 == strncmp(token, "illum", 5) && IS_SPACE(token[5])) {
      token += 6;
      material.illum = parseInt(&token);
      continue;
    }

    // dissolve
    if ((token[0] == 'd' && IS_SPACE(token[1]))) {
      token += 1;
      material.dissolve = parseReal(&token);

      if (has_tr) {
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      }
      has_d = true;
      continue;
    }
    if (token[0] == 'T' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      if (has_d) {
        // `d` wins. Ignore `Tr` value.
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      } else {
        // We invert value of Tr(assume Tr is in range [0, 1])
        // NOTE: Interpretation of Tr is application(exporter) dependent. For
        // some application(e.g. 3ds max obj exporter), Tr = d(Issue 43)
        material.dissolve = static_cast<real_t>(1.0) - parseReal(&token);
      }
      has_tr = true;
      continue;
    }

    // PBR: roughness
    if (token[0] == 'P' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      material.roughness = parseReal(&token);
      continue;
    }

    // PBR: metallic
    if (token[0] == 'P' && token[1] == 'm' && IS_SPACE(token[2])) {
      token += 2;
      material.metallic = parseReal(&token);
      continue;
    }

    // PBR: sheen
    if (token[0] == 'P' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.sheen = parseReal(&token);
      continue;
    }

    // PBR: clearcoat thickness
    if (token[0] == 'P' && token[1] == 'c' && IS_SPACE(token[2])) {
      token += 2;
      material.clearcoat_thickness = parseReal(&token);
      continue;
    }

    // PBR: clearcoat roughness
    if ((0 == strncmp(token, "Pcr", 3)) && IS_SPACE(token[3])) {
      token += 4;
      material.clearcoat_roughness = parseReal(&token);
      continue;
    }

    // PBR: anisotropy
    if ((0 == strncmp(token, "aniso", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.anisotropy = parseReal(&token);
      continue;
    }

    // PBR: anisotropy rotation
    if ((0 == strncmp(token, "anisor", 6)) && IS_SPACE(token[6])) {
      token += 7;
      material.anisotropy_rotation = parseReal(&token);
      continue;
    }

    // ambient texture
    if ((0 == strncmp(token, "map_Ka", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.ambient_texname),
                                &(material.ambient_texopt), token);
      continue;
    }

    // diffuse texture
    if ((0 == strncmp(token, "map_Kd", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.diffuse_texname),
                                &(material.diffuse_texopt), token);

      // Set a decent diffuse default value if a diffuse texture is specified
      // without a matching Kd value.
      if (!has_kd)
      {
        material.diffuse[0] = static_cast<real_t>(0.6);
        material.diffuse[1] = static_cast<real_t>(0.6);
        material.diffuse[2] = static_cast<real_t>(0.6);
      }

      continue;
    }

    // specular texture
    if ((0 == strncmp(token, "map_Ks", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_texname),
                                &(material.specular_texopt), token);
      continue;
    }

    // specular highlight texture
    if ((0 == strncmp(token, "map_Ns", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_highlight_texname),
                                &(material.specular_highlight_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_Bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "bump", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // alpha texture
    if ((0 == strncmp(token, "map_d", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.alpha_texname = token;
      ParseTextureNameAndOption(&(material.alpha_texname),
                                &(material.alpha_texopt), token);
      continue;
    }

    // displacement texture
    if ((0 == strncmp(token, "disp", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.displacement_texname),
                                &(material.displacement_texopt), token);
      continue;
    }

    // reflection map
    if ((0 == strncmp(token, "refl", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.reflection_texname),
                                &(material.reflection_texopt), token);
      continue;
    }

    // PBR: roughness texture
    if ((0 == strncmp(token, "map_Pr", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.roughness_texname),
                                &(material.roughness_texopt), token);
      continue;
    }

    // PBR: metallic texture
    if ((0 == strncmp(token, "map_Pm", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.metallic_texname),
                                &(material.metallic_texopt), token);
      continue;
    }

    // PBR: sheen texture
    if ((0 == strncmp(token, "map_Ps", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.sheen_texname),
                                &(material.sheen_texopt), token);
      continue;
    }

    // PBR: emissive texture
    if ((0 == strncmp(token, "map_Ke", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.emissive_texname),
                                &(material.emissive_texopt), token);
      continue;
    }

    // PBR: normal map texture
    if ((0 == strncmp(token, "norm", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.normal_texname),
                                &(material.normal_texopt), token);
      continue;
    }

    // unknown parameter
    const char *_space = strchr(token, ' ');
    if (!_space) {
      _space = strchr(token, '\t');
    }
    if (_space) {
      std::ptrdiff_t len = _space - token;
      std::string key(token, static_cast<size_t>(len));
      std::string value = _space + 1;
      material.unknown_parameter.insert(
          std::pair<std::string, std::string>(key, value));
    }
  }
  // flush last material.
  material_map->insert(std::pair<std::string, int>(
      material.name, static_cast<int>(materials->size())));
  materials->push_back(material);

  if (warning) {
    (*warning) = warn_ss.str();
  }
}